

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void MIR_gen_set_debug_file(MIR_context_t ctx,FILE *f)

{
  MIR_insn_code_t MVar1;
  ssa_ctx *psVar2;
  MIR_context_t pMVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  target_ctx **pptVar10;
  uint uVar11;
  gen_ctx_t gen_ctx;
  VARR_void_ptr_t *pVVar12;
  void_ptr_t *ppvVar13;
  VARR_MIR_op_t *pVVar14;
  MIR_op_t *pMVar15;
  VARR_MIR_insn_t *pVVar16;
  MIR_insn_t_conflict *ppMVar17;
  VARR_bb_insn_t *pVVar18;
  bb_insn_t_conflict *ppbVar19;
  VARR_loop_node_t *pVVar20;
  loop_node_t_conflict *pplVar21;
  VARR_mem_attr_t *pVVar22;
  mem_attr_t *pmVar23;
  VARR_target_bb_version_t *pVVar24;
  target_bb_version_t *pptVar25;
  VARR_spot_attr_t *pVVar26;
  spot_attr_t *psVar27;
  bitmap_t pVVar28;
  bitmap_el_t *pbVar29;
  data_flow_ctx *pdVar30;
  VARR_bb_t *pVVar31;
  bb_t_conflict *ppbVar32;
  ssa_ctx *psVar33;
  HTAB_def_tab_el_t *pHVar34;
  VARR_HTAB_EL_def_tab_el_t *pVVar35;
  HTAB_EL_def_tab_el_t *pHVar36;
  VARR_htab_ind_t *pVVar37;
  insn_pattern_info_t *piVar38;
  VARR_ssa_edge_t *pVVar39;
  ssa_edge_t_conflict *ppsVar40;
  VARR_size_t *pVVar41;
  size_t *psVar42;
  VARR_char *pVVar43;
  char *pcVar44;
  gvn_ctx *pgVar45;
  VARR_expr_t *pVVar46;
  expr_t *ppeVar47;
  HTAB_expr_t *pHVar48;
  VARR_HTAB_EL_expr_t *pVVar49;
  HTAB_EL_expr_t *pHVar50;
  MIR_insn_t_conflict pMVar51;
  VARR_mem_expr_t *pVVar52;
  mem_expr_t *ppmVar53;
  HTAB_mem_expr_t *pHVar54;
  VARR_HTAB_EL_mem_expr_t *pVVar55;
  HTAB_EL_mem_expr_t *pHVar56;
  VARR_insn_nop_pair_t *pVVar57;
  insn_nop_pair_t *piVar58;
  lr_ctx *plVar59;
  VARR_int *pVVar60;
  int *piVar61;
  VARR_MIR_reg_t *pVVar62;
  MIR_reg_t *pMVar63;
  VARR_live_range_t *pVVar64;
  live_range_t_conflict *pplVar65;
  coalesce_ctx *pcVar66;
  VARR_mv_t *pVVar67;
  mv_t *pmVar68;
  ra_ctx *prVar69;
  VARR_allocno_info_t *pVVar70;
  allocno_info_t *paVar71;
  VARR_bitmap_t *pVVar72;
  bitmap_t *ppVVar73;
  VARR_lr_gap_t *pVVar74;
  lr_gap_t *plVar75;
  VARR_spill_el_t *pVVar76;
  spill_el_t *psVar77;
  long lVar78;
  HTAB_lr_gap_t *pHVar79;
  VARR_HTAB_EL_lr_gap_t *pVVar80;
  HTAB_EL_lr_gap_t *pHVar81;
  VARR_spill_cache_el_t *pVVar82;
  spill_cache_el_t *psVar83;
  combine_ctx *pcVar84;
  VARR_var_ref_t *pVVar85;
  var_ref_t *pvVar86;
  target_ctx *ptVar87;
  VARR_uint8_t *pVVar88;
  uint8_t *puVar89;
  VARR_uint64_t *pVVar90;
  uint64_t *puVar91;
  VARR_const_ref_t *pVVar92;
  const_ref_t *pcVar93;
  VARR_label_ref_t *pVVar94;
  label_ref_t *plVar95;
  VARR_MIR_code_reloc_t *pVVar96;
  MIR_code_reloc_t *pMVar97;
  VARR_call_ref_t *pVVar98;
  call_ref_t *pcVar99;
  byte *pbVar100;
  uint64_t uVar101;
  byte *pbVar102;
  VARR_insn_pattern_info_t *pVVar103;
  void *pvVar104;
  int iVar105;
  ulong uVar106;
  ulong uVar107;
  uint uVar108;
  byte bVar109;
  int iVar110;
  size_t sVar111;
  uint *message;
  int iVar112;
  int iVar113;
  size_t sVar114;
  undefined4 uVar115;
  bool bVar116;
  bool bVar117;
  undefined1 auVar118 [32];
  undefined4 uStack_114;
  uint uStack_110;
  uint uStack_10c;
  undefined4 uStack_e8;
  MIR_op_t MStack_e0;
  target_ctx **pptStack_b0;
  long lStack_a8;
  MIR_context_t pMStack_a0;
  MIR_context_t pMStack_98;
  pattern *ppStack_90;
  MIR_type_t MStack_84;
  MIR_var_t aMStack_80 [2];
  
  if (ctx->gen_ctx != (gen_ctx *)0x0) {
    ctx->gen_ctx->debug_file = f;
    return;
  }
  MIR_gen_set_debug_file_cold_1();
  uVar108 = (uint)f;
  if (ctx->gen_ctx != (gen_ctx *)0x0) {
    ctx->gen_ctx->debug_level = uVar108;
    return;
  }
  MIR_gen_set_debug_level_cold_1();
  if (ctx->gen_ctx != (gen_ctx *)0x0) {
    ctx->gen_ctx->optimize_level = uVar108;
    return;
  }
  MIR_gen_set_optimize_level_cold_1();
  gen_ctx = (gen_ctx_t)gen_malloc((gen_ctx_t)0x0,0x200);
  ctx->gen_ctx = gen_ctx;
  gen_ctx->ctx = ctx;
  gen_ctx->optimize_level = 2;
  gen_ctx->debug_file = (FILE *)0x0;
  gen_ctx->target_ctx = (target_ctx *)0x0;
  gen_ctx->data_flow_ctx = (data_flow_ctx *)0x0;
  gen_ctx->gvn_ctx = (gvn_ctx *)0x0;
  gen_ctx->lr_ctx = (lr_ctx *)0x0;
  gen_ctx->ra_ctx = (ra_ctx *)0x0;
  gen_ctx->combine_ctx = (combine_ctx *)0x0;
  gen_ctx->debug_level = 100;
  pMStack_a0 = ctx;
  pVVar12 = (VARR_void_ptr_t *)malloc(0x18);
  pVVar12->els_num = 0;
  gen_ctx->to_free = pVVar12;
  pVVar12->size = 0x40;
  ppvVar13 = (void_ptr_t *)malloc(0x200);
  pVVar12->varr = ppvVar13;
  gen_ctx->addr_insn_p = 0;
  pVVar14 = (VARR_MIR_op_t *)malloc(0x18);
  pVVar14->els_num = 0;
  gen_ctx->temp_ops = pVVar14;
  pVVar14->size = 0x10;
  pMVar15 = (MIR_op_t *)malloc(0x300);
  pVVar14->varr = pMVar15;
  pVVar16 = (VARR_MIR_insn_t *)malloc(0x18);
  pVVar16->els_num = 0;
  gen_ctx->temp_insns = pVVar16;
  pVVar16->size = 0x10;
  ppMVar17 = (MIR_insn_t_conflict *)malloc(0x80);
  pVVar16->varr = ppMVar17;
  pVVar16 = (VARR_MIR_insn_t *)malloc(0x18);
  pVVar16->els_num = 0;
  gen_ctx->temp_insns2 = pVVar16;
  pVVar16->size = 0x10;
  ppMVar17 = (MIR_insn_t_conflict *)malloc(0x80);
  pVVar16->varr = ppMVar17;
  pVVar18 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar18->els_num = 0;
  gen_ctx->temp_bb_insns = pVVar18;
  pVVar18->size = 0x10;
  ppbVar19 = (bb_insn_t_conflict *)malloc(0x80);
  pVVar18->varr = ppbVar19;
  pVVar18 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar18->els_num = 0;
  gen_ctx->temp_bb_insns2 = pVVar18;
  pVVar18->size = 0x10;
  ppbVar19 = (bb_insn_t_conflict *)malloc(0x80);
  pVVar18->varr = ppbVar19;
  pVVar20 = (VARR_loop_node_t *)malloc(0x18);
  pVVar20->els_num = 0;
  gen_ctx->loop_nodes = pVVar20;
  pVVar20->size = 0x20;
  pplVar21 = (loop_node_t_conflict *)malloc(0x100);
  pVVar20->varr = pplVar21;
  pVVar20 = (VARR_loop_node_t *)malloc(0x18);
  pVVar20->els_num = 0;
  gen_ctx->queue_nodes = pVVar20;
  pVVar20->size = 0x20;
  pplVar21 = (loop_node_t_conflict *)malloc(0x100);
  pVVar20->varr = pplVar21;
  pVVar20 = (VARR_loop_node_t *)malloc(0x18);
  pVVar20->els_num = 0;
  gen_ctx->loop_entries = pVVar20;
  pVVar20->size = 0x10;
  pplVar21 = (loop_node_t_conflict *)malloc(0x80);
  pVVar20->varr = pplVar21;
  pVVar22 = (VARR_mem_attr_t *)malloc(0x18);
  pVVar22->els_num = 0;
  gen_ctx->mem_attrs = pVVar22;
  pVVar22->size = 0x20;
  pmVar23 = (mem_attr_t *)malloc(0x400);
  pVVar22->varr = pmVar23;
  pVVar24 = (VARR_target_bb_version_t *)malloc(0x18);
  pVVar24->els_num = 0;
  gen_ctx->target_succ_bb_versions = pVVar24;
  pVVar24->size = 0x10;
  pptVar25 = (target_bb_version_t *)malloc(0x80);
  pVVar24->varr = pptVar25;
  pVVar12 = (VARR_void_ptr_t *)malloc(0x18);
  pVVar12->els_num = 0;
  gen_ctx->succ_bb_addrs = pVVar12;
  pVVar12->size = 0x10;
  ppvVar13 = (void_ptr_t *)malloc(0x80);
  pVVar12->varr = ppvVar13;
  pVVar26 = (VARR_spot_attr_t *)malloc(0x18);
  pVVar26->els_num = 0;
  gen_ctx->spot_attrs = pVVar26;
  pVVar26->size = 0x20;
  psVar27 = (spot_attr_t *)malloc(0x200);
  pVVar26->varr = psVar27;
  pVVar26 = (VARR_spot_attr_t *)malloc(0x18);
  pVVar26->els_num = 0;
  gen_ctx->spot2attr = pVVar26;
  pVVar26->size = 0x20;
  psVar27 = (spot_attr_t *)malloc(0x200);
  pVVar26->varr = psVar27;
  pVVar28 = (bitmap_t)malloc(0x18);
  pVVar28->els_num = 0;
  pVVar28->size = 4;
  pbVar29 = (bitmap_el_t *)malloc(0x20);
  pVVar28->varr = pbVar29;
  gen_ctx->temp_bitmap = pVVar28;
  pVVar28 = (bitmap_t)malloc(0x18);
  pVVar28->els_num = 0;
  pVVar28->size = 4;
  pbVar29 = (bitmap_el_t *)malloc(0x20);
  pVVar28->varr = pbVar29;
  gen_ctx->temp_bitmap2 = pVVar28;
  pVVar28 = (bitmap_t)malloc(0x18);
  pVVar28->els_num = 0;
  pVVar28->size = 4;
  pbVar29 = (bitmap_el_t *)malloc(0x20);
  gen_ctx->temp_bitmap3 = pVVar28;
  pVVar28->varr = pbVar29;
  (gen_ctx->free_dead_vars).head = (dead_var_t_conflict)0x0;
  (gen_ctx->free_dead_vars).tail = (dead_var_t_conflict)0x0;
  pdVar30 = (data_flow_ctx *)gen_malloc(gen_ctx,0x18);
  gen_ctx->data_flow_ctx = pdVar30;
  pVVar31 = (VARR_bb_t *)malloc(0x18);
  pVVar31->els_num = 0;
  pdVar30->worklist = pVVar31;
  pVVar31->size = 0x40;
  ppbVar32 = (bb_t_conflict *)malloc(0x200);
  pVVar31->varr = ppbVar32;
  pVVar31 = (VARR_bb_t *)malloc(0x18);
  pVVar31->els_num = 0;
  pdVar30->pending = pVVar31;
  pVVar31->size = 0x40;
  ppbVar32 = (bb_t_conflict *)malloc(0x200);
  pVVar31->varr = ppbVar32;
  pVVar28 = (bitmap_t)malloc(0x18);
  pVVar28->els_num = 0;
  pVVar28->size = 8;
  pbVar29 = (bitmap_el_t *)malloc(0x40);
  pVVar28->varr = pbVar29;
  pdVar30->bb_to_consider = pVVar28;
  psVar33 = (ssa_ctx *)gen_malloc(gen_ctx,0x40);
  gen_ctx->ssa_ctx = psVar33;
  pVVar18 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar18->els_num = 0;
  psVar33->arg_bb_insns = pVVar18;
  pVVar18->size = 0x40;
  ppbVar19 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar18->varr = ppbVar19;
  pVVar18 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar18->els_num = 0;
  psVar33->undef_insns = pVVar18;
  pVVar18->size = 0x40;
  ppbVar19 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar18->varr = ppbVar19;
  pVVar18 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar18->els_num = 0;
  psVar33->phis = pVVar18;
  pVVar18->size = 0x40;
  ppbVar19 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar18->varr = ppbVar19;
  pVVar18 = (VARR_bb_insn_t *)malloc(0x18);
  pVVar18->els_num = 0;
  psVar33->deleted_phis = pVVar18;
  pVVar18->size = 0x40;
  ppbVar19 = (bb_insn_t_conflict *)malloc(0x200);
  message = (uint *)0x40;
  pVVar18->varr = ppbVar19;
  pHVar34 = (HTAB_def_tab_el_t *)malloc(0x40);
  if (pHVar34 == (HTAB_def_tab_el_t *)0x0) {
LAB_001516ca:
    mir_htab_error((char *)message);
  }
  pVVar35 = (VARR_HTAB_EL_def_tab_el_t *)malloc(0x18);
  pVVar35->els_num = 0;
  pHVar34->els = pVVar35;
  pVVar35->size = 0x400;
  pHVar36 = (HTAB_EL_def_tab_el_t *)malloc(0x8000);
  pVVar35->varr = pHVar36;
  if (pHVar36 == (HTAB_EL_def_tab_el_t *)0x0) {
    MIR_gen_init_cold_14();
LAB_001516d4:
    MIR_gen_init_cold_12();
LAB_001516d9:
    MIR_gen_init_cold_10();
  }
  else {
    pptStack_b0 = &gen_ctx->target_ctx;
    pVVar35->size = 0x400;
    pVVar35->els_num = 0x400;
    pVVar37 = (VARR_htab_ind_t *)malloc(0x18);
    message = (uint *)0x2000;
    pVVar37->els_num = 0;
    pHVar34->entries = pVVar37;
    pVVar37->size = 0x800;
    piVar38 = (insn_pattern_info_t *)malloc(0x2000);
    pHVar34->arg = gen_ctx;
    sVar114 = 0x800;
    iVar110 = 0x800;
    pVVar37->varr = (htab_ind_t *)piVar38;
    pHVar34->hash_func = def_tab_el_hash;
    pHVar34->eq_func = def_tab_el_eq;
    pHVar34->free_func = (_func_void_def_tab_el_t_void_ptr *)0x0;
    pHVar34->els_num = 0;
    pHVar34->els_start = 0;
    pHVar34->els_bound = 0;
    pHVar34->collisions = 0;
    uVar107 = 0;
    do {
      if (piVar38 == (insn_pattern_info_t *)0x0) goto LAB_001516a9;
      uVar106 = uVar107 + 1;
      if (sVar114 < uVar106) {
        sVar114 = (uVar106 >> 1) + uVar106;
        message = (uint *)piVar38;
        piVar38 = (insn_pattern_info_t *)realloc(piVar38,sVar114 * 4);
        pVVar37->varr = (htab_ind_t *)piVar38;
        pVVar37->size = sVar114;
        uVar107 = pVVar37->els_num;
        uVar106 = uVar107 + 1;
      }
      iVar110 = iVar110 + -1;
      (&piVar38->start)[uVar107] = 0xffffffff;
      pVVar37->els_num = uVar106;
      uVar107 = uVar106;
    } while (iVar110 != 0);
    psVar2 = gen_ctx->ssa_ctx;
    psVar33->def_tab = pHVar34;
    pVVar39 = (VARR_ssa_edge_t *)malloc(0x18);
    psVar2->ssa_edges_to_process = pVVar39;
    pVVar39->els_num = 0;
    pVVar39->size = 0x200;
    ppsVar40 = (ssa_edge_t_conflict *)malloc(0x1000);
    psVar33 = gen_ctx->ssa_ctx;
    pVVar39->varr = ppsVar40;
    pVVar41 = (VARR_size_t *)malloc(0x18);
    psVar33->curr_reg_indexes = pVVar41;
    pVVar41->els_num = 0;
    pVVar41->size = 0x1000;
    psVar42 = (size_t *)malloc(0x8000);
    psVar33 = gen_ctx->ssa_ctx;
    pVVar41->varr = psVar42;
    pVVar43 = (VARR_char *)malloc(0x18);
    psVar33->reg_name = pVVar43;
    pVVar43->els_num = 0;
    pVVar43->size = 0x14;
    pcVar44 = (char *)malloc(0x14);
    pVVar43->varr = pcVar44;
    pMVar3 = gen_ctx->ctx;
    pgVar45 = (gvn_ctx *)gen_malloc(gen_ctx,0x30);
    gen_ctx->gvn_ctx = pgVar45;
    pVVar46 = (VARR_expr_t *)malloc(0x18);
    pgVar45->exprs = pVVar46;
    pVVar46->els_num = 0;
    pVVar46->size = 0x200;
    ppeVar47 = (expr_t *)malloc(0x1000);
    message = (uint *)0x40;
    pVVar46->varr = ppeVar47;
    pHVar48 = (HTAB_expr_t *)malloc(0x40);
    if (pHVar48 == (HTAB_expr_t *)0x0) goto LAB_001516ca;
    pVVar49 = (VARR_HTAB_EL_expr_t *)malloc(0x18);
    pVVar49->els_num = 0;
    pHVar48->els = pVVar49;
    pVVar49->size = 0x400;
    pHVar50 = (HTAB_EL_expr_t *)malloc(0x4000);
    pVVar49->varr = pHVar50;
    if (pHVar50 == (HTAB_EL_expr_t *)0x0) goto LAB_001516d4;
    pVVar49->size = 0x400;
    pVVar49->els_num = 0x400;
    pVVar37 = (VARR_htab_ind_t *)malloc(0x18);
    message = (uint *)0x2000;
    pVVar37->els_num = 0;
    pHVar48->entries = pVVar37;
    pVVar37->size = 0x800;
    piVar38 = (insn_pattern_info_t *)malloc(0x2000);
    sVar114 = 0x800;
    iVar110 = 0x800;
    pVVar37->varr = (htab_ind_t *)piVar38;
    pHVar48->arg = gen_ctx;
    pHVar48->hash_func = expr_hash;
    pHVar48->eq_func = expr_eq;
    pHVar48->free_func = (_func_void_expr_t_void_ptr *)0x0;
    pHVar48->els_num = 0;
    pHVar48->els_start = 0;
    pHVar48->els_bound = 0;
    pHVar48->collisions = 0;
    uVar107 = 0;
    do {
      if (piVar38 == (insn_pattern_info_t *)0x0) goto LAB_001516ae;
      uVar106 = uVar107 + 1;
      if (sVar114 < uVar106) {
        sVar114 = (uVar106 >> 1) + uVar106;
        message = (uint *)piVar38;
        piVar38 = (insn_pattern_info_t *)realloc(piVar38,sVar114 * 4);
        pVVar37->varr = (htab_ind_t *)piVar38;
        pVVar37->size = sVar114;
        uVar107 = pVVar37->els_num;
        uVar106 = uVar107 + 1;
      }
      iVar110 = iVar110 + -1;
      (&piVar38->start)[uVar107] = 0xffffffff;
      pVVar37->els_num = uVar106;
      uVar107 = uVar106;
    } while (iVar110 != 0);
    pgVar45->expr_tab = pHVar48;
    _MIR_new_var_mem_op(&MStack_e0,pMVar3,MIR_T_I64,0,0xffffffff,0xffffffff,'\0');
    _MIR_new_var_op(pMVar3,0);
    pMVar51 = MIR_new_insn(pMVar3,MIR_MOV);
    pgVar45 = gen_ctx->gvn_ctx;
    pgVar45->temp_mem_insn = pMVar51;
    pVVar52 = (VARR_mem_expr_t *)malloc(0x18);
    pgVar45->mem_exprs = pVVar52;
    pVVar52->els_num = 0;
    pVVar52->size = 0x100;
    ppmVar53 = (mem_expr_t *)malloc(0x800);
    pgVar45 = gen_ctx->gvn_ctx;
    message = (uint *)0x40;
    pVVar52->varr = ppmVar53;
    pHVar54 = (HTAB_mem_expr_t *)malloc(0x40);
    if (pHVar54 == (HTAB_mem_expr_t *)0x0) goto LAB_001516ca;
    pVVar55 = (VARR_HTAB_EL_mem_expr_t *)malloc(0x18);
    pVVar55->els_num = 0;
    pHVar54->els = pVVar55;
    pVVar55->size = 0x200;
    pHVar56 = (HTAB_EL_mem_expr_t *)malloc(0x2000);
    pVVar55->varr = pHVar56;
    if (pHVar56 == (HTAB_EL_mem_expr_t *)0x0) goto LAB_001516d9;
    pVVar55->size = 0x200;
    pVVar55->els_num = 0x200;
    pVVar37 = (VARR_htab_ind_t *)malloc(0x18);
    message = (uint *)0x1000;
    pVVar37->els_num = 0;
    pHVar54->entries = pVVar37;
    pVVar37->size = 0x400;
    piVar38 = (insn_pattern_info_t *)malloc(0x1000);
    pHVar54->arg = gen_ctx;
    sVar114 = 0x400;
    iVar110 = 0x400;
    pVVar37->varr = (htab_ind_t *)piVar38;
    pHVar54->hash_func = mem_expr_hash;
    pHVar54->eq_func = mem_expr_eq;
    pHVar54->free_func = (_func_void_mem_expr_t_void_ptr *)0x0;
    pHVar54->els_num = 0;
    pHVar54->els_start = 0;
    pHVar54->els_bound = 0;
    pHVar54->collisions = 0;
    uVar107 = 0;
    do {
      if (piVar38 == (insn_pattern_info_t *)0x0) goto LAB_001516b3;
      uVar106 = uVar107 + 1;
      if (sVar114 < uVar106) {
        sVar114 = (uVar106 >> 1) + uVar106;
        message = (uint *)piVar38;
        piVar38 = (insn_pattern_info_t *)realloc(piVar38,sVar114 * 4);
        pVVar37->varr = (htab_ind_t *)piVar38;
        pVVar37->size = sVar114;
        uVar107 = pVVar37->els_num;
        uVar106 = uVar107 + 1;
      }
      iVar110 = iVar110 + -1;
      (&piVar38->start)[uVar107] = 0xffffffff;
      pVVar37->els_num = uVar106;
      uVar107 = uVar106;
    } while (iVar110 != 0);
    pgVar45->mem_expr_tab = pHVar54;
    pgVar45 = gen_ctx->gvn_ctx;
    pVVar57 = (VARR_insn_nop_pair_t *)malloc(0x18);
    pgVar45->insn_nop_pairs = pVVar57;
    pVVar57->els_num = 0;
    pVVar57->size = 0x10;
    piVar58 = (insn_nop_pair_t *)malloc(0x100);
    pVVar57->varr = piVar58;
    plVar59 = (lr_ctx *)gen_malloc(gen_ctx,0x68);
    gen_ctx->lr_ctx = plVar59;
    pVVar60 = (VARR_int *)malloc(0x18);
    plVar59->var_to_scan_var_map = pVVar60;
    pVVar60->els_num = 0;
    pVVar60->size = 0x40;
    piVar61 = (int *)malloc(0x100);
    pVVar60->varr = piVar61;
    pVVar62 = (VARR_MIR_reg_t *)malloc(0x18);
    pVVar62->els_num = 0;
    plVar59->scan_var_to_var_map = pVVar62;
    pVVar62->size = 0x40;
    pMVar63 = (MIR_reg_t *)malloc(0x100);
    pVVar62->varr = pMVar63;
    pVVar64 = (VARR_live_range_t *)malloc(0x18);
    pVVar64->els_num = 0;
    pVVar64->size = 0x40;
    plVar59->free_lr_list = (live_range_t_conflict)0x0;
    plVar59->free_lr_bb_list = (lr_bb_t_conflict)0x0;
    plVar59->var_live_ranges = pVVar64;
    pplVar65 = (live_range_t_conflict *)malloc(0x200);
    pVVar64->varr = pplVar65;
    pVVar60 = (VARR_int *)malloc(0x18);
    pVVar60->els_num = 0;
    plVar59->point_map = pVVar60;
    pVVar60->size = 0x400;
    piVar61 = (int *)malloc(0x1000);
    pVVar60->varr = piVar61;
    pVVar28 = (bitmap_t)malloc(0x18);
    pVVar28->els_num = 0;
    pVVar28->size = 4;
    pbVar29 = (bitmap_el_t *)malloc(0x20);
    pVVar28->varr = pbVar29;
    plVar59->live_vars = pVVar28;
    pVVar28 = (bitmap_t)malloc(0x18);
    pVVar28->els_num = 0;
    pVVar28->size = 4;
    pbVar29 = (bitmap_el_t *)malloc(0x20);
    pVVar28->varr = pbVar29;
    plVar59->referenced_vars = pVVar28;
    pVVar28 = (bitmap_t)malloc(0x18);
    pVVar28->els_num = 0;
    pVVar28->size = 4;
    pbVar29 = (bitmap_el_t *)malloc(0x20);
    pVVar28->varr = pbVar29;
    plVar59->points_with_born_vars = pVVar28;
    pVVar28 = (bitmap_t)malloc(0x18);
    pVVar28->els_num = 0;
    pVVar28->size = 4;
    pbVar29 = (bitmap_el_t *)malloc(0x20);
    pVVar28->varr = pbVar29;
    plVar59->points_with_dead_vars = pVVar28;
    pVVar28 = (bitmap_t)malloc(0x18);
    pVVar28->els_num = 0;
    pVVar28->size = 4;
    pbVar29 = (bitmap_el_t *)malloc(0x20);
    pVVar28->varr = pbVar29;
    plVar59->points_with_born_or_dead_vars = pVVar28;
    pcVar66 = (coalesce_ctx *)gen_malloc(gen_ctx,0x20);
    gen_ctx->coalesce_ctx = pcVar66;
    pVVar67 = (VARR_mv_t *)malloc(0x18);
    pVVar67->els_num = 0;
    pcVar66->moves = pVVar67;
    pVVar67->size = 0x40;
    pmVar68 = (mv_t *)malloc(0x400);
    pVVar67->varr = pmVar68;
    pVVar62 = (VARR_MIR_reg_t *)malloc(0x18);
    pVVar62->els_num = 0;
    pVVar62->size = 0x40;
    pcVar66->first_coalesced_reg = pVVar62;
    pMVar63 = (MIR_reg_t *)malloc(0x100);
    pVVar62->varr = pMVar63;
    pVVar62 = (VARR_MIR_reg_t *)malloc(0x18);
    pVVar62->els_num = 0;
    pcVar66->next_coalesced_reg = pVVar62;
    pVVar62->size = 0x40;
    pMVar63 = (MIR_reg_t *)malloc(0x100);
    pVVar62->varr = pMVar63;
    pVVar28 = (bitmap_t)malloc(0x18);
    pVVar28->els_num = 0;
    pVVar28->size = 0x40;
    pbVar29 = (bitmap_el_t *)malloc(0x200);
    pVVar28->varr = pbVar29;
    pcVar66->conflict_matrix = pVVar28;
    prVar69 = (ra_ctx *)gen_malloc(gen_ctx,0x248);
    gen_ctx->ra_ctx = prVar69;
    pVVar62 = (VARR_MIR_reg_t *)malloc(0x18);
    pVVar62->els_num = 0;
    prVar69->reg_renumber = pVVar62;
    pVVar62->size = 0x40;
    pMVar63 = (MIR_reg_t *)malloc(0x100);
    pVVar62->varr = pMVar63;
    pVVar70 = (VARR_allocno_info_t *)malloc(0x18);
    pVVar70->els_num = 0;
    prVar69->sorted_regs = pVVar70;
    pVVar70->size = 0x40;
    paVar71 = (allocno_info_t *)malloc(0x400);
    pVVar70->varr = paVar71;
    pVVar72 = (VARR_bitmap_t *)malloc(0x18);
    pVVar72->els_num = 0;
    prVar69->used_locs = pVVar72;
    pVVar72->size = 0x40;
    ppVVar73 = (bitmap_t *)malloc(0x200);
    pVVar72->varr = ppVVar73;
    pVVar72 = (VARR_bitmap_t *)malloc(0x18);
    pVVar72->els_num = 0;
    prVar69->busy_used_locs = pVVar72;
    pVVar72->size = 0x40;
    ppVVar73 = (bitmap_t *)malloc(0x200);
    pVVar72->varr = ppVVar73;
    pVVar72 = (VARR_bitmap_t *)malloc(0x18);
    pVVar72->els_num = 0;
    prVar69->var_bbs = pVVar72;
    pVVar72->size = 0x40;
    ppVVar73 = (bitmap_t *)malloc(0x200);
    pVVar72->varr = ppVVar73;
    pVVar74 = (VARR_lr_gap_t *)malloc(0x18);
    pVVar74->els_num = 0;
    prVar69->spill_gaps = pVVar74;
    pVVar74->size = 0x40;
    plVar75 = (lr_gap_t *)malloc(0x400);
    pVVar74->varr = plVar75;
    pVVar74 = (VARR_lr_gap_t *)malloc(0x18);
    pVVar74->els_num = 0;
    prVar69->curr_gaps = pVVar74;
    pVVar74->size = 0x40;
    plVar75 = (lr_gap_t *)malloc(0x400);
    pVVar74->varr = plVar75;
    pVVar76 = (VARR_spill_el_t *)malloc(0x18);
    pVVar76->els_num = 0;
    prVar69->spill_els = pVVar76;
    pVVar76->size = 0x40;
    psVar77 = (spill_el_t *)malloc(0x400);
    pVVar76->varr = psVar77;
    lVar78 = 8;
    do {
      gen_ctx->ra_ctx->lr_gap_bitmaps[lVar78 + -8] = (bitmap_t)0x0;
      lVar78 = lVar78 + 1;
    } while (lVar78 != 0x2a);
    prVar69 = gen_ctx->ra_ctx;
    message = (uint *)0x40;
    pHVar79 = (HTAB_lr_gap_t *)malloc(0x40);
    if (pHVar79 == (HTAB_lr_gap_t *)0x0) goto LAB_001516ca;
    pVVar80 = (VARR_HTAB_EL_lr_gap_t *)malloc(0x18);
    pVVar80->els_num = 0;
    pHVar79->els = pVVar80;
    pVVar80->size = 0x400;
    pHVar81 = (HTAB_EL_lr_gap_t *)malloc(0x6000);
    pVVar80->varr = pHVar81;
    if (pHVar81 != (HTAB_EL_lr_gap_t *)0x0) {
      pVVar80->size = 0x400;
      pVVar80->els_num = 0x400;
      pVVar37 = (VARR_htab_ind_t *)malloc(0x18);
      message = (uint *)0x2000;
      pVVar37->els_num = 0;
      pHVar79->entries = pVVar37;
      pVVar37->size = 0x800;
      piVar38 = (insn_pattern_info_t *)malloc(0x2000);
      sVar114 = 0x800;
      iVar110 = 0x800;
      pHVar79->arg = (void *)0x0;
      pVVar37->varr = (htab_ind_t *)piVar38;
      pHVar79->hash_func = lr_gap_hash;
      pHVar79->eq_func = lr_gap_eq;
      pHVar79->free_func = (_func_void_lr_gap_t_void_ptr *)0x0;
      pHVar79->els_num = 0;
      pHVar79->els_start = 0;
      pHVar79->els_bound = 0;
      pHVar79->collisions = 0;
      uVar107 = 0;
      do {
        if (piVar38 == (insn_pattern_info_t *)0x0) goto LAB_001516b8;
        uVar106 = uVar107 + 1;
        if (sVar114 < uVar106) {
          sVar114 = (uVar106 >> 1) + uVar106;
          message = (uint *)piVar38;
          piVar38 = (insn_pattern_info_t *)realloc(piVar38,sVar114 * 4);
          pVVar37->varr = (htab_ind_t *)piVar38;
          pVVar37->size = sVar114;
          uVar107 = pVVar37->els_num;
          uVar106 = uVar107 + 1;
        }
        iVar110 = iVar110 + -1;
        (&piVar38->start)[uVar107] = 0xffffffff;
        pVVar37->els_num = uVar106;
        uVar107 = uVar106;
      } while (iVar110 != 0);
      prVar69->lr_gap_tab = pHVar79;
      prVar69 = gen_ctx->ra_ctx;
      pVVar82 = (VARR_spill_cache_el_t *)malloc(0x18);
      prVar69->spill_cache = pVVar82;
      pVVar82->els_num = 0;
      pVVar82->size = 0x40;
      psVar83 = (spill_cache_el_t *)malloc(0x200);
      prVar69 = gen_ctx->ra_ctx;
      pVVar82->varr = psVar83;
      prVar69->spill_cache_age = 0;
      pVVar28 = (bitmap_t)malloc(0x18);
      pVVar28->els_num = 0;
      pVVar28->size = 1;
      pbVar29 = (bitmap_el_t *)malloc(8);
      pVVar28->varr = pbVar29;
      prVar69->conflict_locs1 = pVVar28;
      pcVar84 = (combine_ctx *)gen_malloc(gen_ctx,0x50);
      gen_ctx->combine_ctx = pcVar84;
      pcVar84->curr_bb_var_ref_age = 0;
      pVVar41 = (VARR_size_t *)malloc(0x18);
      pVVar41->els_num = 0;
      pcVar84->var_ref_ages = pVVar41;
      pVVar41->size = 0x40;
      psVar42 = (size_t *)malloc(0x200);
      pVVar41->varr = psVar42;
      pVVar85 = (VARR_var_ref_t *)malloc(0x18);
      pVVar85->els_num = 0;
      pcVar84->var_refs = pVVar85;
      pVVar85->size = 0x40;
      pvVar86 = (var_ref_t *)malloc(0x800);
      pVVar85->varr = pvVar86;
      pVVar62 = (VARR_MIR_reg_t *)malloc(0x18);
      pVVar62->els_num = 0;
      pcVar84->insn_vars = pVVar62;
      pVVar62->size = 0x40;
      pMVar63 = (MIR_reg_t *)malloc(0x100);
      pVVar62->varr = pMVar63;
      pVVar41 = (VARR_size_t *)malloc(0x18);
      pVVar41->els_num = 0;
      pcVar84->changed_op_numbers = pVVar41;
      pVVar41->size = 0x10;
      psVar42 = (size_t *)malloc(0x80);
      pVVar41->varr = psVar42;
      pVVar14 = (VARR_MIR_op_t *)malloc(0x18);
      pVVar14->els_num = 0;
      pcVar84->last_right_ops = pVVar14;
      pVVar14->size = 0x10;
      pMVar15 = (MIR_op_t *)malloc(0x300);
      pVVar14->varr = pMVar15;
      pVVar28 = (bitmap_t)malloc(0x18);
      pVVar28->els_num = 0;
      pVVar28->size = 0x40;
      pbVar29 = (bitmap_el_t *)malloc(0x200);
      pMStack_98 = gen_ctx->ctx;
      pVVar28->varr = pbVar29;
      pcVar84->vars_bitmap = pVVar28;
      ptVar87 = (target_ctx *)gen_malloc(gen_ctx,0x68);
      gen_ctx->target_ctx = ptVar87;
      pVVar88 = (VARR_uint8_t *)malloc(0x18);
      pVVar88->els_num = 0;
      ptVar87->result_code = pVVar88;
      pVVar88->size = 0x40;
      puVar89 = (uint8_t *)malloc(0x40);
      pVVar88->varr = puVar89;
      pVVar60 = (VARR_int *)malloc(0x18);
      pVVar60->els_num = 0;
      ptVar87->insn_pattern_indexes = pVVar60;
      pVVar60->size = 0x40;
      piVar61 = (int *)malloc(0x100);
      pVVar60->varr = piVar61;
      pVVar90 = (VARR_uint64_t *)malloc(0x18);
      pVVar90->els_num = 0;
      ptVar87->const_pool = pVVar90;
      pVVar90->size = 0x40;
      puVar91 = (uint64_t *)malloc(0x200);
      pVVar90->varr = puVar91;
      pVVar92 = (VARR_const_ref_t *)malloc(0x18);
      pVVar92->els_num = 0;
      ptVar87->const_refs = pVVar92;
      pVVar92->size = 0x40;
      pcVar93 = (const_ref_t *)malloc(0xa00);
      pVVar92->varr = pcVar93;
      pVVar94 = (VARR_label_ref_t *)malloc(0x18);
      pVVar94->els_num = 0;
      ptVar87->label_refs = pVVar94;
      pVVar94->size = 0x40;
      plVar95 = (label_ref_t *)malloc(0x800);
      pVVar94->varr = plVar95;
      pVVar90 = (VARR_uint64_t *)malloc(0x18);
      pVVar90->els_num = 0;
      ptVar87->abs_address_locs = pVVar90;
      pVVar90->size = 0x40;
      puVar91 = (uint64_t *)malloc(0x200);
      pVVar90->varr = puVar91;
      pVVar96 = (VARR_MIR_code_reloc_t *)malloc(0x18);
      pVVar96->els_num = 0;
      ptVar87->relocs = pVVar96;
      pVVar96->size = 0x40;
      pMVar97 = (MIR_code_reloc_t *)malloc(0x400);
      pVVar96->varr = pMVar97;
      pVVar98 = (VARR_call_ref_t *)malloc(0x18);
      pVVar98->els_num = 0;
      ptVar87->call_refs = pVVar98;
      pVVar98->size = 0x40;
      pcVar99 = (call_ref_t *)malloc(0x400);
      pVVar98->varr = pcVar99;
      MStack_84 = MIR_T_D;
      aMStack_80[0].size = 0;
      aMStack_80[0].type = MIR_T_D;
      aMStack_80[0]._4_4_ = 0;
      aMStack_80[0].name = "src";
      _MIR_register_unspec_insn(gen_ctx->ctx,0,"movdqa",1,&MStack_84,1,0,aMStack_80);
      ptVar87 = gen_ctx->target_ctx;
      pVVar60 = (VARR_int *)malloc(0x18);
      ptVar87->pattern_indexes = pVVar60;
      lVar78 = 0;
      pVVar60->els_num = 0;
      pVVar60->size = 0x40;
      piVar61 = (int *)malloc(0x100);
      pVVar60->varr = piVar61;
LAB_00150b9c:
      iVar110 = 0;
      ppStack_90 = patterns + lVar78;
      pbVar102 = (byte *)patterns[lVar78].replacement;
      lStack_a8 = lVar78;
LAB_00150bc6:
      iVar112 = 0;
      iVar105 = 0;
      iVar113 = 0;
      uVar115 = 0;
      uStack_10c = 0;
      uStack_114 = 0;
      uStack_e8 = 0;
      uStack_110 = 0;
      bVar117 = false;
      uVar108 = 0;
      bVar9 = false;
      bVar7 = false;
      bVar8 = false;
LAB_00150c28:
      message = &switchD_00150cbb::switchdataD_001b1020;
      bVar109 = *pbVar102;
      MStack_e0.data = pbVar102;
      if ((bVar109 == 0) || (bVar109 == 0x3b)) goto LAB_00151042;
      if (((int)(char)bVar109 - 0x30U < 10) ||
         (pbVar100 = pbVar102, '6' < (char)bVar109 && (int)(char)bVar109 - 0x41U < 6)) {
        if (iVar112 != 0) {
          if (iVar105 == 0) {
            iVar105 = 1;
          }
          else {
            iVar105 = 1;
            bVar116 = iVar113 != 0;
            iVar113 = 1;
            if (bVar116) {
              __assert_fail("!opcode2_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x90d,"int get_max_insn_size(gen_ctx_t, const char *)");
            }
          }
        }
        pbVar100 = pbVar102 + 2;
        iVar112 = 1;
        bVar109 = pbVar102[2];
      }
      uVar11 = uStack_110;
      MStack_e0.data = pbVar100;
      bVar116 = bVar117;
      if (bVar109 < 0x2f) {
        if (bVar109 < 0x20) {
          if (bVar109 != 9) {
            if (bVar109 != 0) goto switchD_00150cbb_caseD_4b;
            goto LAB_00151042;
          }
        }
        else if (bVar109 != 0x20) {
          if (bVar109 != 0x2b) goto switchD_00150cbb_caseD_4b;
          MStack_e0.data = pbVar100 + 1;
          if (pbVar100[1] != 0x68) {
            iVar112 = 1;
            if ((byte)(pbVar100[1] - 0x30) < 3) goto LAB_00151020;
            goto LAB_0015163e;
          }
          iVar112 = 1;
          MStack_e0.data = pbVar100 + 2;
        }
        goto LAB_00151020;
      }
      switch(bVar109) {
      case 0x48:
      case 0x68:
        MStack_e0.data = pbVar100 + 1;
        read_hex((char **)&MStack_e0);
      case 0x71:
        uVar115 = 1;
        break;
      case 0x49:
      case 0x4a:
      case 0x69:
        MStack_e0.data = pbVar100 + 1;
        if ((pbVar100[1] & 0xf8) != 0x30) {
          __assert_fail("\'0\' <= ch && ch <= \'7\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x948,"int get_max_insn_size(gen_ctx_t, const char *)");
        }
        if (bVar109 == 0x69) {
          bVar116 = true;
        }
        else if (bVar109 == 0x49) {
          bVar9 = true;
        }
        else {
          bVar7 = true;
        }
        break;
      case 0x4b:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x51:
      case 0x55:
      case 0x57:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x62:
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x6a:
      case 0x6b:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x73:
      case 0x74:
      case 0x75:
switchD_00150cbb_caseD_4b:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x988,"int get_max_insn_size(gen_ctx_t, const char *)");
      case 0x4c:
        uVar108 = 1;
        goto LAB_00150f68;
      case 0x50:
        MStack_e0.data = pbVar100 + 1;
        uVar115 = 1;
        uVar108 = 1;
        if ((pbVar100[1] & 0xf8) != 0x30) {
          __assert_fail("\'0\' <= ch && ch <= \'7\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x95c,"int get_max_insn_size(gen_ctx_t, const char *)");
        }
        break;
      case 0x52:
      case 0x53:
      case 0x72:
        MStack_e0.data = pbVar100 + 1;
        uVar115 = 1;
        if (2 < (byte)(pbVar100[1] - 0x30)) {
          __assert_fail("\'0\' <= ch && ch <= \'2\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x924,"int get_max_insn_size(gen_ctx_t, const char *)");
        }
        break;
      case 0x54:
        uVar115 = 1;
        bVar8 = true;
        break;
      case 0x56:
      case 0x76:
        MStack_e0.data = pbVar100 + 1;
        read_hex((char **)&MStack_e0);
        bVar116 = true;
        if (bVar109 != 0x76) {
          bVar9 = true;
          bVar116 = bVar117;
        }
        break;
      case 0x58:
      case 0x59:
      case 0x5a:
        if (iVar112 == 0) {
          uStack_10c = 1;
          iVar112 = 0;
        }
        else {
          iVar112 = 0;
          uStack_10c = 1;
          uStack_e8 = 1;
          if (iVar105 != 0) {
            __assert_fail("!opcode1_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x91a,"int get_max_insn_size(gen_ctx_t, const char *)");
          }
        }
        break;
      case 0x61:
        MStack_e0.data = pbVar100 + 1;
        bVar109 = pbVar100[1];
        if (bVar109 == 0x70) {
          uStack_114 = 1;
          uVar108 = 1;
        }
        else if (bVar109 == 0x6d) {
          uStack_114 = 1;
        }
        else {
          if (bVar109 != 100) {
            __assert_fail("ch == \'m\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x941,"int get_max_insn_size(gen_ctx_t, const char *)");
          }
          MStack_e0.data = pbVar100 + 2;
          uVar101 = read_hex((char **)&MStack_e0);
          uStack_114 = 1;
          uVar11 = 1;
          if ((long)(char)uVar101 != uVar101) {
            uVar11 = uStack_110;
            uVar108 = 1;
          }
        }
        break;
      case 99:
        MStack_e0.data = pbVar100 + 1;
        read_hex((char **)&MStack_e0);
        bVar117 = uVar108 != 0;
        uVar108 = 1;
        if (bVar117) {
          __assert_fail("!disp32_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x971,"int get_max_insn_size(gen_ctx_t, const char *)");
        }
        break;
      case 0x6c:
        uStack_110 = 1;
LAB_00150f68:
        MStack_e0.data = pbVar100 + 1;
        uVar11 = uStack_110;
        if (2 < (byte)(pbVar100[1] - 0x30)) {
          __assert_fail("\'0\' <= ch && ch <= \'2\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x958,"int get_max_insn_size(gen_ctx_t, const char *)");
        }
        break;
      case 0x6d:
        MStack_e0.data = pbVar100 + 1;
        uVar115 = 1;
        if ((pbVar100[1] | 0x20) == 0x74) {
          uStack_114 = 1;
          uStack_110 = 1;
          uVar11 = uStack_110;
        }
        else {
          uStack_114 = 1;
          uVar108 = 1;
          if (2 < (byte)(pbVar100[1] - 0x30)) {
            __assert_fail("\'0\' <= ch && ch <= \'2\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x930,"int get_max_insn_size(gen_ctx_t, const char *)");
          }
        }
        break;
      default:
        if (bVar109 == 0x2f) {
          MStack_e0.data = pbVar100 + 1;
          uVar115 = 1;
          if ((pbVar100[1] & 0xf8) != 0x30) {
            __assert_fail("\'0\' <= ch && ch <= \'7\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x962,"int get_max_insn_size(gen_ctx_t, const char *)");
          }
          break;
        }
        if (bVar109 != 0x3b) goto switchD_00150cbb_caseD_4b;
LAB_00151042:
        auVar4 = vpinsrd_avx(ZEXT416(uStack_10c),uVar115,1);
        auVar4 = vpinsrd_avx(auVar4,uStack_114,2);
        auVar5 = vpinsrd_avx(ZEXT416(uStack_110),iVar112,1);
        auVar5 = vpinsrd_avx(auVar5,iVar105,2);
        auVar5 = vpinsrd_avx(auVar5,iVar113,3);
        auVar4 = vpinsrd_avx(auVar4,uStack_e8,3);
        auVar118._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar4;
        auVar118._16_16_ = ZEXT116(1) * auVar5;
        uVar6 = vptestmd_avx512vl(auVar118,auVar118);
        iVar105 = iVar110 + 4;
        if (uVar108 == 0) {
          iVar105 = iVar110;
        }
        iVar105 = (iVar105 + POPCOUNT((int)uVar6) + 1) - (uint)!bVar117;
        iVar110 = iVar105 + 4;
        if (!bVar9) {
          iVar110 = iVar105;
        }
        iVar105 = iVar110 + 8;
        if (!bVar7) {
          iVar105 = iVar110;
        }
        iVar110 = iVar105 + 4;
        if (!bVar8) {
          iVar110 = iVar105;
        }
        pbVar102 = (byte *)((long)MStack_e0.data + 1);
        if (bVar109 == 0) goto code_r0x001510e2;
        goto LAB_00150bc6;
      }
LAB_00151020:
      bVar117 = bVar116;
      uStack_110 = uVar11;
      pbVar102 = (byte *)((long)MStack_e0.data + 1);
      goto LAB_00150c28;
    }
  }
  MIR_gen_init_cold_8();
LAB_001516e3:
  MIR_gen_init_cold_5();
LAB_001516eb:
  MIR_gen_init_cold_3();
LAB_001516f0:
  __assert_fail("prev_code != MIR_INSN_BOUND",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x770,"void patterns_init(gen_ctx_t)");
code_r0x001510e2:
  ppStack_90->max_insn_size = iVar110;
  pVVar60 = (*pptStack_b0)->pattern_indexes;
  piVar61 = pVVar60->varr;
  if (piVar61 == (int *)0x0) goto LAB_001516bd;
  sVar114 = pVVar60->els_num;
  uVar107 = sVar114 + 1;
  if (pVVar60->size < uVar107) {
    sVar114 = (uVar107 >> 1) + uVar107;
    piVar61 = (int *)realloc(piVar61,sVar114 * 4);
    pVVar60->varr = piVar61;
    pVVar60->size = sVar114;
    sVar114 = pVVar60->els_num;
    uVar107 = sVar114 + 1;
  }
  pptVar10 = pptStack_b0;
  pVVar60->els_num = uVar107;
  piVar61[sVar114] = (int)lStack_a8;
  lVar78 = lStack_a8 + 1;
  if (lVar78 == 0x2d9) goto code_r0x0015116d;
  goto LAB_00150b9c;
code_r0x0015116d:
  if ((*pptStack_b0)->pattern_indexes == (VARR_int *)0x0) goto LAB_001516e3;
  qsort((*pptStack_b0)->pattern_indexes->varr,0x2d9,4,pattern_index_cmp);
  ptVar87 = *pptVar10;
  pVVar103 = (VARR_insn_pattern_info_t *)malloc(0x18);
  message = (uint *)0x200;
  ptVar87->insn_pattern_info = pVVar103;
  pVVar103->els_num = 0;
  pVVar103->size = 0x40;
  piVar38 = (insn_pattern_info_t *)malloc(0x200);
  iVar110 = 0xbc;
  pVVar103->varr = piVar38;
  do {
    pVVar103 = (*pptVar10)->insn_pattern_info;
    piVar38 = pVVar103->varr;
    if (piVar38 == (insn_pattern_info_t *)0x0) goto LAB_001516c5;
    sVar114 = pVVar103->els_num;
    uVar107 = sVar114 + 1;
    if (pVVar103->size < uVar107) {
      sVar114 = (uVar107 >> 1) + uVar107;
      message = (uint *)piVar38;
      piVar38 = (insn_pattern_info_t *)realloc(piVar38,sVar114 * 8);
      pVVar103->varr = piVar38;
      pVVar103->size = sVar114;
      sVar114 = pVVar103->els_num;
      uVar107 = sVar114 + 1;
    }
    pMVar3 = pMStack_98;
    iVar110 = iVar110 + -1;
    pVVar103->els_num = uVar107;
    piVar38[sVar114].start = 0;
    piVar38[sVar114].num = 0;
  } while (iVar110 != 0);
  pVVar103 = (*pptVar10)->insn_pattern_info;
  if (pVVar103 != (VARR_insn_pattern_info_t *)0x0) {
    pVVar60 = (*pptVar10)->pattern_indexes;
    if ((pVVar60 == (VARR_int *)0x0) || (piVar61 = pVVar60->varr, piVar61 == (int *)0x0)) {
LAB_001516a4:
      MIR_gen_init_cold_2();
LAB_001516a9:
      MIR_gen_init_cold_13();
LAB_001516ae:
      MIR_gen_init_cold_11();
LAB_001516b3:
      MIR_gen_init_cold_9();
LAB_001516b8:
      MIR_gen_init_cold_7();
LAB_001516bd:
      MIR_gen_init_cold_6();
LAB_001516c5:
      MIR_gen_init_cold_4();
      goto LAB_001516ca;
    }
    piVar38 = pVVar103->varr;
    sVar114 = pVVar60->els_num;
    message = (uint *)0xbc;
    sVar111 = 0;
    do {
      if (sVar114 == sVar111) goto LAB_001516a4;
      MVar1 = patterns[piVar61[sVar111]].code;
      if (MVar1 != (MIR_insn_code_t)message) {
        if (sVar111 == 0) {
          iVar110 = 0;
        }
        else {
          iVar110 = (int)sVar111;
          piVar38[(long)message].num = iVar110 - piVar38[(long)message].start;
        }
        piVar38[MVar1].start = iVar110;
        message = (uint *)(ulong)MVar1;
      }
      sVar111 = sVar111 + 1;
    } while (sVar111 != 0x2d9);
    if ((int)message != 0xbc) {
      iVar105 = 0;
      piVar38[(long)message].num = 0x2d9 - piVar38[(long)message].start;
      MIR_new_label_op(pMStack_98,(MIR_label_t)0x0);
      pMVar51 = MIR_new_insn(pMVar3,MIR_JMP);
      gen_ctx->target_ctx->temp_jump = pMVar51;
      iVar110 = find_insn_pattern(gen_ctx,pMVar51,(int *)0x0);
      uVar108 = 0;
      gen_ctx->target_ctx->temp_jump_pat_ind = iVar110;
      iVar110 = 0;
      gen_ctx->max_int_hard_regs = 0;
      gen_ctx->max_fp_hard_regs = 0;
      do {
        if ((0x20 < (uVar108 & 0x3e)) || ((0x101000410U >> (uVar108 & 0x3e) & 1) == 0)) {
          if (uVar108 < 0x10) {
            iVar110 = iVar110 + 1;
            gen_ctx->max_int_hard_regs = iVar110;
          }
          else {
            iVar105 = iVar105 + 1;
            gen_ctx->max_fp_hard_regs = iVar105;
          }
        }
        uVar108 = uVar108 + 1;
      } while (uVar108 != 0x22);
      lVar78 = 0;
      do {
        pVVar28 = (bitmap_t)malloc(0x18);
        pVVar28->els_num = 0;
        pVVar28->size = 1;
        pbVar29 = (bitmap_el_t *)malloc(8);
        uVar107 = 0;
        pVVar28->varr = pbVar29;
        gen_ctx->call_used_hard_regs[lVar78] = pVVar28;
        do {
          if (uVar107 != 3 && ((uint)uVar107 & 0x3c) != 0xc) {
            pVVar28 = gen_ctx->call_used_hard_regs[lVar78];
            bitmap_expand(pVVar28,uVar107 + 1);
            if (pVVar28 == (bitmap_t)0x0) {
              MIR_gen_init_cold_1();
LAB_0015163e:
              __assert_fail("\'0\' <= ch && ch <= \'2\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x96a,"int get_max_insn_size(gen_ctx_t, const char *)");
            }
            *pVVar28->varr = *pVVar28->varr | 1L << (uVar107 & 0x3f);
          }
          uVar107 = uVar107 + 1;
        } while (uVar107 != 0x22);
        lVar78 = lVar78 + 1;
        if (lVar78 == 0x13) {
          pVVar28 = (bitmap_t)malloc(0x18);
          pVVar28->els_num = 0;
          pVVar28->size = 4;
          pbVar29 = (bitmap_el_t *)malloc(0x20);
          pVVar28->varr = pbVar29;
          gen_ctx->tied_regs = pVVar28;
          pVVar28 = (bitmap_t)malloc(0x18);
          pVVar28->els_num = 0;
          pVVar28->size = 4;
          pbVar29 = (bitmap_el_t *)malloc(0x20);
          pVVar28->varr = pbVar29;
          gen_ctx->addr_regs = pVVar28;
          pVVar28 = (bitmap_t)malloc(0x18);
          pVVar28->els_num = 0;
          pVVar28->size = 0x10;
          pbVar29 = (bitmap_el_t *)malloc(0x80);
          pVVar28->varr = pbVar29;
          gen_ctx->insn_to_consider = pVVar28;
          pVVar28 = (bitmap_t)malloc(0x18);
          pVVar28->els_num = 0;
          pVVar28->size = 1;
          pbVar29 = (bitmap_el_t *)malloc(8);
          pVVar28->varr = pbVar29;
          gen_ctx->func_used_hard_regs = pVVar28;
          pvVar104 = _MIR_get_bb_wrapper(pMStack_a0,gen_ctx,bb_version_generator);
          gen_ctx->bb_wrapper = pvVar104;
          gen_ctx->overall_bbs_num = 0;
          gen_ctx->overall_gen_bbs_num = 0;
          return;
        }
      } while( true );
    }
    goto LAB_001516f0;
  }
  goto LAB_001516eb;
}

Assistant:

void MIR_gen_set_debug_file (MIR_context_t ctx, FILE *f) {
#if !MIR_NO_GEN_DEBUG
  gen_ctx_t gen_ctx = *gen_ctx_loc (ctx);
  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_set_debug_file before MIR_gen_init -- good bye\n");
    exit (1);
  }
  debug_file = f;
#endif
}